

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

bool __thiscall
cmMakefile::CompileFeatureKnown
          (cmMakefile *this,cmTarget *target,string *feature,string *lang,string *error)

{
  cmake *this_00;
  cmMakefile *pcVar1;
  size_type sVar2;
  char **ppcVar3;
  ostream *poVar4;
  string *psVar5;
  char *pcVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_250;
  size_type local_248;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_240;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_230;
  size_type local_228;
  char local_220 [8];
  undefined8 uStack_218;
  cmMakefile *local_210;
  string local_208;
  cmStrCmp local_1e8;
  cmStrCmp local_1c8;
  ostringstream e;
  
  sVar2 = cmGeneratorExpression::Find(feature);
  if (sVar2 != 0xffffffffffffffff) {
    __assert_fail("cmGeneratorExpression::Find(feature) == std::string::npos",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmMakefile.cxx"
                  ,0x116a,
                  "bool cmMakefile::CompileFeatureKnown(const cmTarget *, const std::string &, std::string &, std::string *) const"
                 );
  }
  std::__cxx11::string::string((string *)&local_230,(string *)feature);
  local_1c8.m_test._M_dataplus._M_p = (pointer)&local_1c8.m_test.field_2;
  if (local_230 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220) {
    local_1c8.m_test.field_2._8_8_ = uStack_218;
  }
  else {
    local_1c8.m_test._M_dataplus._M_p = (pointer)local_230;
  }
  local_1c8.m_test._M_string_length = local_228;
  local_228 = 0;
  local_220[0] = '\0';
  local_230 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_220;
  local_210 = this;
  ppcVar3 = std::find_if<char_const*const*,cmStrCmp>(C_FEATURES + 1,CXX_FEATURES,&local_1c8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_230);
  if (ppcVar3 == CXX_FEATURES) {
    std::__cxx11::string::string((string *)&local_250,(string *)feature);
    local_1e8.m_test._M_dataplus._M_p = (pointer)&local_1e8.m_test.field_2;
    if (local_250 == &local_240) {
      local_1e8.m_test.field_2._8_8_ = local_240._8_8_;
    }
    else {
      local_1e8.m_test._M_dataplus._M_p = (pointer)local_250;
    }
    local_1e8.m_test._M_string_length = local_248;
    local_248 = 0;
    local_240._M_local_buf[0] = '\0';
    local_250 = &local_240;
    ppcVar3 = std::find_if<char_const*const*,cmStrCmp>
                        (CXX_FEATURES + 1,(char **)&DAT_005bb098,&local_1e8);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::__cxx11::string::~string((string *)&local_250);
    if (ppcVar3 == (char **)&DAT_005bb098) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      pcVar6 = "specified";
      if (error == (string *)0x0) {
        pcVar6 = "Specified";
      }
      std::operator<<((ostream *)&e,pcVar6);
      poVar4 = std::operator<<((ostream *)&e," unknown feature \"");
      poVar4 = std::operator<<(poVar4,(string *)feature);
      poVar4 = std::operator<<(poVar4,"\" for target \"");
      psVar5 = cmTarget::GetName_abi_cxx11_(target);
      poVar4 = std::operator<<(poVar4,(string *)psVar5);
      std::operator<<(poVar4,"\".");
      pcVar1 = local_210;
      if (error == (string *)0x0) {
        this_00 = local_210->GlobalGenerator->CMakeInstance;
        std::__cxx11::stringbuf::str();
        cmake::IssueMessage(this_00,FATAL_ERROR,&local_208,&pcVar1->Backtrace);
      }
      else {
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::operator=((string *)error,(string *)&local_208);
      }
      std::__cxx11::string::~string((string *)&local_208);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
      return false;
    }
  }
  std::__cxx11::string::assign((char *)lang);
  return true;
}

Assistant:

bool cmMakefile::CompileFeatureKnown(cmTarget const* target,
                                     const std::string& feature,
                                     std::string& lang,
                                     std::string* error) const
{
  assert(cmGeneratorExpression::Find(feature) == std::string::npos);

  bool isCFeature =
    std::find_if(cm::cbegin(C_FEATURES) + 1, cm::cend(C_FEATURES),
                 cmStrCmp(feature)) != cm::cend(C_FEATURES);
  if (isCFeature) {
    lang = "C";
    return true;
  }
  bool isCxxFeature =
    std::find_if(cm::cbegin(CXX_FEATURES) + 1, cm::cend(CXX_FEATURES),
                 cmStrCmp(feature)) != cm::cend(CXX_FEATURES);
  if (isCxxFeature) {
    lang = "CXX";
    return true;
  }
  std::ostringstream e;
  if (error) {
    e << "specified";
  } else {
    e << "Specified";
  }
  e << " unknown feature \"" << feature
    << "\" for "
       "target \""
    << target->GetName() << "\".";
  if (error) {
    *error = e.str();
  } else {
    this->GetCMakeInstance()->IssueMessage(MessageType::FATAL_ERROR, e.str(),
                                           this->Backtrace);
  }
  return false;
}